

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O0

bool boost::xpressive::detail::
     advance_to_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,long>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *param_1,
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *param_2)

{
  difference_type dVar1;
  
  if ((long)param_2 < 1) {
    if (((long)param_2 < 0) &&
       (dVar1 = __gnu_cxx::operator-(param_1,param_2), dVar1 < -(long)param_2)) {
      return false;
    }
  }
  else {
    dVar1 = __gnu_cxx::operator-(param_1,param_2);
    if (dVar1 < (long)param_2) {
      return false;
    }
  }
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator+=(param_1,(difference_type)param_2);
  return true;
}

Assistant:

inline bool advance_to_impl(RandIter & iter, Diff diff, RandIter end, std::random_access_iterator_tag)
{
    if(0 < diff)
    {
        if((end - iter) < diff)
            return false;
    }
    else if(0 > diff)
    {
        if((iter - end) < -diff)
            return false;
    }
    iter += diff;
    return true;
}